

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O0

int LaplaceMatrix(sunrealtype c,SUNMatrix Jac,UserData udata)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  sunindextype i;
  sunrealtype dx;
  sunindextype N;
  UserData udata_local;
  SUNMatrix Jac_local;
  sunrealtype c_local;
  
  lVar2 = udata->N;
  dVar1 = udata->dx;
  for (i = 1; i < lVar2 + -1; i = i + 1) {
    lVar3 = *(long *)(*(long *)((long)Jac->content + 0x40) + (i + -1) * 0x18);
    lVar4 = *(long *)((long)Jac->content + 0x28) + 3;
    *(double *)(lVar3 + lVar4 * 8) =
         ((c * udata->du) / dVar1) / dVar1 + *(double *)(lVar3 + lVar4 * 8);
    lVar3 = *(long *)(*(long *)((long)Jac->content + 0x40) + 8 + (i + -1) * 0x18);
    lVar4 = *(long *)((long)Jac->content + 0x28) + 3;
    *(double *)(lVar3 + lVar4 * 8) =
         ((c * udata->dv) / dVar1) / dVar1 + *(double *)(lVar3 + lVar4 * 8);
    lVar3 = *(long *)(*(long *)((long)Jac->content + 0x40) + 0x10 + (i + -1) * 0x18);
    lVar4 = *(long *)((long)Jac->content + 0x28) + 3;
    *(double *)(lVar3 + lVar4 * 8) =
         ((c * udata->dw) / dVar1) / dVar1 + *(double *)(lVar3 + lVar4 * 8);
    lVar3 = *(long *)(*(long *)((long)Jac->content + 0x40) + i * 0x18);
    lVar4 = *(long *)((long)Jac->content + 0x28);
    *(double *)(lVar3 + lVar4 * 8) =
         ((-c * 2.0 * udata->du) / dVar1) / dVar1 + *(double *)(lVar3 + lVar4 * 8);
    lVar3 = *(long *)(*(long *)((long)Jac->content + 0x40) + 8 + i * 0x18);
    lVar4 = *(long *)((long)Jac->content + 0x28);
    *(double *)(lVar3 + lVar4 * 8) =
         ((-c * 2.0 * udata->dv) / dVar1) / dVar1 + *(double *)(lVar3 + lVar4 * 8);
    lVar3 = *(long *)(*(long *)((long)Jac->content + 0x40) + 0x10 + i * 0x18);
    lVar4 = *(long *)((long)Jac->content + 0x28);
    *(double *)(lVar3 + lVar4 * 8) =
         ((-c * 2.0 * udata->dw) / dVar1) / dVar1 + *(double *)(lVar3 + lVar4 * 8);
    lVar3 = *(long *)(*(long *)((long)Jac->content + 0x40) + (i + 1) * 0x18);
    lVar4 = *(long *)((long)Jac->content + 0x28) + -3;
    *(double *)(lVar3 + lVar4 * 8) =
         ((c * udata->du) / dVar1) / dVar1 + *(double *)(lVar3 + lVar4 * 8);
    lVar3 = *(long *)(*(long *)((long)Jac->content + 0x40) + 8 + (i + 1) * 0x18);
    lVar4 = *(long *)((long)Jac->content + 0x28) + -3;
    *(double *)(lVar3 + lVar4 * 8) =
         ((c * udata->dv) / dVar1) / dVar1 + *(double *)(lVar3 + lVar4 * 8);
    lVar3 = *(long *)(*(long *)((long)Jac->content + 0x40) + 0x10 + (i + 1) * 0x18);
    lVar4 = *(long *)((long)Jac->content + 0x28) + -3;
    *(double *)(lVar3 + lVar4 * 8) =
         ((c * udata->dw) / dVar1) / dVar1 + *(double *)(lVar3 + lVar4 * 8);
  }
  return 0;
}

Assistant:

static int LaplaceMatrix(sunrealtype c, SUNMatrix Jac, UserData udata)
{
  sunindextype N = udata->N; /* set shortcuts */
  sunrealtype dx = udata->dx;
  sunindextype i;

  /* iterate over intervals, filling in Jacobian of (L*y) using SM_ELEMENT_B
     macro (see sunmatrix_band.h) */
  for (i = 1; i < N - 1; i++)
  {
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i - 1, 0)) += c * udata->du / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i - 1, 1)) += c * udata->dv / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i - 1, 2)) += c * udata->dw / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 0)) += -c * SUN_RCONST(2.0) *
                                               udata->du / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 1)) += -c * SUN_RCONST(2.0) *
                                               udata->dv / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i, 2)) += -c * SUN_RCONST(2.0) *
                                               udata->dw / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i + 1, 0)) += c * udata->du / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i + 1, 1)) += c * udata->dv / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i + 1, 2)) += c * udata->dw / dx / dx;
  }

  /* Return with success */
  return 0;
}